

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_showref.cpp
# Opt level: O1

BaseTableColumnInfo duckdb::FindBaseTableColumn(LogicalOperator *op,idx_t column_index)

{
  reference pvVar1;
  idx_t in_RCX;
  BaseTableColumnInfo BVar2;
  ColumnBinding binding;
  vector<duckdb::ColumnBinding,_true> bindings;
  vector<duckdb::ColumnBinding,_true> local_30;
  
  (*op->_vptr_LogicalOperator[2])(&local_30,op);
  pvVar1 = vector<duckdb::ColumnBinding,_true>::operator[](&local_30,column_index);
  binding.column_index = in_RCX;
  binding.table_index = pvVar1->column_index;
  BVar2 = FindBaseTableColumn((duckdb *)op,(LogicalOperator *)pvVar1->table_index,binding);
  if (local_30.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return BVar2;
}

Assistant:

BaseTableColumnInfo FindBaseTableColumn(LogicalOperator &op, idx_t column_index) {
	auto bindings = op.GetColumnBindings();
	return FindBaseTableColumn(op, bindings[column_index]);
}